

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw.c
# Opt level: O0

char * raw_init(BackendVtable *vt,Seat *seat,Backend **backend_handle,LogContext *logctx,Conf *conf,
               char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  int addressfamily_00;
  undefined8 *__s;
  Conf *pCVar1;
  char *pcVar2;
  SockAddr *addr_00;
  Socket *pSVar3;
  char *colon;
  char *loghost;
  int addressfamily;
  Raw *raw;
  char *err;
  SockAddr *addr;
  _Bool keepalive_local;
  _Bool nodelay_local;
  char *host_local;
  Conf *conf_local;
  LogContext *logctx_local;
  Backend **backend_handle_local;
  Seat *seat_local;
  BackendVtable *vt_local;
  
  __s = (undefined8 *)safemalloc(1,0x78,0);
  memset(__s,0,0x78);
  __s[9] = &Raw_plugvt;
  __s[10] = vt;
  __s[0xc] = &Raw_interactorvt;
  __s[0xb] = __s + 0xc;
  *__s = 0;
  *(undefined1 *)(__s + 1) = 0;
  *backend_handle = (Backend *)(__s + 10);
  *(undefined1 *)((long)__s + 0x31) = 0;
  *(undefined1 *)(__s + 6) = 0;
  __s[2] = 0;
  *(undefined1 *)((long)__s + 0x32) = 0;
  pCVar1 = conf_copy(conf);
  __s[8] = pCVar1;
  pcVar2 = default_description(vt,host,port);
  __s[7] = pcVar2;
  __s[3] = seat;
  __s[4] = logctx;
  addressfamily_00 = conf_get_int(conf,3);
  addr_00 = name_lookup(host,port,realhost,conf,addressfamily_00,(LogContext *)__s[4],
                        "main connection");
  pcVar2 = sk_addr_error(addr_00);
  if (pcVar2 == (char *)0x0) {
    if (port < 0) {
      port = 0x17;
    }
    pSVar3 = new_connection(addr_00,*realhost,port,false,true,nodelay,keepalive,(Plug *)(__s + 9),
                            conf,(Interactor *)(__s + 0xc));
    *__s = pSVar3;
    pcVar2 = sk_socket_error((Socket *)*__s);
    if (pcVar2 == (char *)0x0) {
      seat_set_trust_status((Seat *)__s[3],false);
      pcVar2 = conf_get_str(conf,9);
      if (*pcVar2 != '\0') {
        safefree(*realhost);
        pcVar2 = dupstr(pcVar2);
        *realhost = pcVar2;
        pcVar2 = host_strrchr(*realhost,0x3a);
        if (pcVar2 != (char *)0x0) {
          *pcVar2 = '\0';
        }
      }
      vt_local = (BackendVtable *)0x0;
    }
    else {
      vt_local = (BackendVtable *)dupstr(pcVar2);
    }
  }
  else {
    sk_addr_free(addr_00);
    vt_local = (BackendVtable *)dupstr(pcVar2);
  }
  return (char *)vt_local;
}

Assistant:

static char *raw_init(const BackendVtable *vt, Seat *seat,
                      Backend **backend_handle, LogContext *logctx,
                      Conf *conf, const char *host, int port,
                      char **realhost, bool nodelay, bool keepalive)
{
    SockAddr *addr;
    const char *err;
    Raw *raw;
    int addressfamily;
    char *loghost;

    raw = snew(Raw);
    memset(raw, 0, sizeof(Raw));
    raw->plug.vt = &Raw_plugvt;
    raw->backend.vt = vt;
    raw->interactor.vt = &Raw_interactorvt;
    raw->backend.interactor = &raw->interactor;
    raw->s = NULL;
    raw->closed_on_socket_error = false;
    *backend_handle = &raw->backend;
    raw->sent_console_eof = raw->sent_socket_eof = false;
    raw->bufsize = 0;
    raw->socket_connected = false;
    raw->conf = conf_copy(conf);
    raw->description = default_description(vt, host, port);

    raw->seat = seat;
    raw->logctx = logctx;

    addressfamily = conf_get_int(conf, CONF_addressfamily);
    /*
     * Try to find host.
     */
    addr = name_lookup(host, port, realhost, conf, addressfamily,
                       raw->logctx, "main connection");
    if ((err = sk_addr_error(addr)) != NULL) {
        sk_addr_free(addr);
        return dupstr(err);
    }

    if (port < 0)
        port = 23;                     /* default telnet port */

    /*
     * Open socket.
     */
    raw->s = new_connection(addr, *realhost, port, false, true, nodelay,
                            keepalive, &raw->plug, conf, &raw->interactor);
    if ((err = sk_socket_error(raw->s)) != NULL)
        return dupstr(err);

    /* No local authentication phase in this protocol */
    seat_set_trust_status(raw->seat, false);

    loghost = conf_get_str(conf, CONF_loghost);
    if (*loghost) {
        char *colon;

        sfree(*realhost);
        *realhost = dupstr(loghost);

        colon = host_strrchr(*realhost, ':');
        if (colon)
            *colon++ = '\0';
    }

    return NULL;
}